

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonMap.cpp
# Opt level: O0

void __thiscall JsonMapImpl::deserialize(JsonMapImpl *this,istream *stream)

{
  ulong uVar1;
  runtime_error *this_00;
  exception *e;
  istream *stream_local;
  JsonMapImpl *this_local;
  
  uVar1 = std::ios::good();
  if ((uVar1 & 1) == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Input stream is not valid");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  nlohmann::operator>>(stream,&this->m_jsonObject);
  return;
}

Assistant:

void JsonMapImpl::deserialize(std::istream& stream) {
    if(!stream.good()) {
        throw std::runtime_error("Input stream is not valid");
    }

    try {
        stream >> m_jsonObject;
    } catch (std::exception& e) {
        // nlohmann::json raises std::exception on parser errors, but the client of JsonMap only
        // handles std::runtime_error because they don't want to "handle" programming errors
        // (std::logic_error).
        //
        // As such, we translate the exception type here.
        throw std::runtime_error(e.what());
    }
}